

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  int line;
  char *test_name;
  char *file;
  anon_class_72_2_4f66548f_for_factory_ local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string full_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string message;
  CodeLocation *location_local;
  string *name_local;
  
  message.field_2._8_8_ = location;
  std::operator+(&local_58,"Paramaterized test suite ",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
                );
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_a8,"UninstantiatedParamaterizedTestSuite<",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_a8,">");
  std::__cxx11::string::~string((string *)&local_a8);
  test_name = (char *)std::__cxx11::string::c_str();
  file = (char *)std::__cxx11::string::c_str();
  line = location->line;
  std::__cxx11::string::string((string *)&local_f0,(string *)local_38);
  CodeLocation::CodeLocation(&local_f0.location,location);
  RegisterTest<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_LLNL[P]Adiak_blt_thirdparty_builtin_googletest_master_2020_01_07_googletest_src_gtest_cc:465:45)>
            ("GoogleTestVerification",test_name,(char *)0x0,(char *)0x0,file,line,&local_f0);
  InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation)::$_0::~__0
            ((__0 *)&local_f0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}